

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O1

void Curl_conn_cf_add(Curl_easy *data,connectdata *conn,int index,Curl_cfilter *cf)

{
  curl_trc_feat *pcVar1;
  
  cf->next = conn->cfilter[index];
  cf->conn = conn;
  cf->sockindex = index;
  conn->cfilter[index] = cf;
  if ((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) {
    pcVar1 = (data->state).feat;
    if (pcVar1 == (curl_trc_feat *)0x0) {
      if (cf == (Curl_cfilter *)0x0) {
        return;
      }
    }
    else {
      if (cf == (Curl_cfilter *)0x0) {
        return;
      }
      if (pcVar1->log_level < 1) {
        return;
      }
    }
    if (0 < cf->cft->log_level) {
      Curl_trc_cf_infof(data,cf,"added");
      return;
    }
  }
  return;
}

Assistant:

void Curl_conn_cf_add(struct Curl_easy *data,
                      struct connectdata *conn,
                      int index,
                      struct Curl_cfilter *cf)
{
  (void)data;
  DEBUGASSERT(conn);
  DEBUGASSERT(!cf->conn);
  DEBUGASSERT(!cf->next);

  cf->next = conn->cfilter[index];
  cf->conn = conn;
  cf->sockindex = index;
  conn->cfilter[index] = cf;
  CURL_TRC_CF(data, cf, "added");
}